

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::CreateSortKeyBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  PhysicalType type;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  undefined8 uVar5;
  pointer pEVar6;
  LogicalType *pLVar7;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  PhysicalType physical_type;
  idx_t i_2;
  idx_t constant_size;
  bool all_constant;
  idx_t i_1;
  string sort_specifier_str;
  Value sort_specifier;
  idx_t i;
  templated_unique_single_t result;
  undefined4 in_stack_fffffffffffffd78;
  CollationType in_stack_fffffffffffffd7c;
  Value *in_stack_fffffffffffffd80;
  undefined6 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8e;
  undefined1 in_stack_fffffffffffffd8f;
  ClientContext *in_stack_fffffffffffffd90;
  reference in_stack_fffffffffffffd98;
  LogicalTypeId id;
  LogicalType *this;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  BinderException *in_stack_fffffffffffffdf0;
  allocator *paVar9;
  Value *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe58;
  Expression *in_stack_fffffffffffffe60;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> context_00;
  LogicalType *local_168;
  PhysicalType *local_160;
  ulong local_150;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [32];
  Value local_f8;
  undefined1 local_b1;
  undefined1 local_b0 [39];
  allocator local_89;
  string local_88 [32];
  ulong local_68;
  undefined1 local_55;
  string *in_stack_ffffffffffffffb8;
  string local_40 [32];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  
  context_00._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  local_20 = in_RCX;
  sVar4 = ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::size(in_RCX);
  if ((sVar4 & 1) != 0) {
    local_55 = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    paVar9 = (allocator *)&stack0xffffffffffffffbf;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_40,
               "Arguments to create_sort_key must be [key1, sort_specifier1, key2, sort_specifier2, ...]"
               ,paVar9);
    BinderException::BinderException
              ((BinderException *)in_stack_fffffffffffffd80,
               (string *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_55 = 0;
    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  make_uniq<duckdb::CreateSortKeyBindData>();
  local_68 = 1;
  while( true ) {
    uVar8 = local_68;
    sVar4 = ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size(local_20);
    if (sVar4 <= uVar8) {
      local_150 = 0;
      while (uVar8 = local_150,
            sVar4 = ::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ::size(local_20), uVar8 < sVar4) {
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffd80,
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffd80,
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffd80);
        ExpressionBinder::PushCollation
                  (in_stack_fffffffffffffd90,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   CONCAT17(in_stack_fffffffffffffd8f,
                            CONCAT16(in_stack_fffffffffffffd8e,in_stack_fffffffffffffd88)),
                   &in_stack_fffffffffffffd80->type_,in_stack_fffffffffffffd7c);
        local_150 = local_150 + 2;
      }
      bVar1 = true;
      local_160 = (PhysicalType *)0x0;
      local_168 = (LogicalType *)0x0;
      while( true ) {
        id = (LogicalTypeId)((ulong)in_stack_fffffffffffffd98 >> 0x38);
        this = local_168;
        pLVar7 = (LogicalType *)
                 ::std::
                 vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ::size(local_20);
        if (pLVar7 <= this) break;
        in_stack_fffffffffffffd98 =
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)in_stack_fffffffffffffd80,
                          CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)in_stack_fffffffffffffd80);
        type = LogicalType::InternalType(&pEVar6->return_type);
        bVar2 = TypeIsConstantSize(type);
        if (bVar2) {
          in_stack_fffffffffffffd80 = (Value *)GetTypeIdSize((PhysicalType)(uVar8 >> 0x38));
          local_160 = &(in_stack_fffffffffffffd80->type_).physical_type_ + (long)local_160;
        }
        else {
          bVar1 = false;
        }
        local_168 = (LogicalType *)&local_168->field_0x2;
      }
      if ((bVar1) && (local_160 < (PhysicalType *)0x9)) {
        LogicalType::LogicalType(this,id);
        LogicalType::operator=
                  (&in_stack_fffffffffffffd80->type_,
                   (LogicalType *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        LogicalType::~LogicalType((LogicalType *)0x13e69f3);
      }
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<duckdb::CreateSortKeyBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffd80,
                 (unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>_>
                  *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>,_true>
      ::~unique_ptr((unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>,_true>
                     *)0x13e6a17);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffd80,
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffd80);
    uVar3 = (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[0xf])();
    if ((uVar3 & 1) == 0) break;
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffd80,
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffd80);
    ExpressionExecutor::EvaluateScalar
              ((ClientContext *)context_00._M_head_impl,in_stack_fffffffffffffe60,
               SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0));
    bVar1 = Value::IsNull(&local_f8);
    if (bVar1) {
      local_11a = 1;
      uVar5 = __cxa_allocate_exception(0x10);
      paVar9 = &local_119;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_118,"sort_specifier cannot be NULL",paVar9);
      BinderException::BinderException
                ((BinderException *)in_stack_fffffffffffffd80,
                 (string *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_11a = 0;
      __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
    }
    Value::ToString_abi_cxx11_(in_stack_fffffffffffffe18);
    in_stack_fffffffffffffde0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>,_true>
         ::operator->((unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>,_true>
                       *)in_stack_fffffffffffffd80);
    OrderModifiers::Parse(in_stack_ffffffffffffffb8);
    ::std::vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>::push_back
              ((vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_> *)
               in_stack_fffffffffffffd80,
               (value_type *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    ::std::__cxx11::string::~string(local_140);
    Value::~Value(in_stack_fffffffffffffd80);
    local_68 = local_68 + 2;
  }
  local_b1 = 1;
  uVar5 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_88,"sort_specifier must be a constant value - but got %s",&local_89);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd80,
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd80);
  (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(local_b0);
  BinderException::BinderException<std::__cxx11::string>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  local_b1 = 0;
  __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
}

Assistant:

unique_ptr<FunctionData> CreateSortKeyBind(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	if (arguments.size() % 2 != 0) {
		throw BinderException(
		    "Arguments to create_sort_key must be [key1, sort_specifier1, key2, sort_specifier2, ...]");
	}
	auto result = make_uniq<CreateSortKeyBindData>();
	for (idx_t i = 1; i < arguments.size(); i += 2) {
		if (!arguments[i]->IsFoldable()) {
			throw BinderException("sort_specifier must be a constant value - but got %s", arguments[i]->ToString());
		}

		// Rebind to return a date if we are truncating that far
		Value sort_specifier = ExpressionExecutor::EvaluateScalar(context, *arguments[i]);
		if (sort_specifier.IsNull()) {
			throw BinderException("sort_specifier cannot be NULL");
		}
		auto sort_specifier_str = sort_specifier.ToString();
		result->modifiers.push_back(OrderModifiers::Parse(sort_specifier_str));
	}
	// push collations
	for (idx_t i = 0; i < arguments.size(); i += 2) {
		ExpressionBinder::PushCollation(context, arguments[i], arguments[i]->return_type);
	}
	// check if all types are constant
	bool all_constant = true;
	idx_t constant_size = 0;
	for (idx_t i = 0; i < arguments.size(); i += 2) {
		auto physical_type = arguments[i]->return_type.InternalType();
		if (!TypeIsConstantSize(physical_type)) {
			all_constant = false;
		} else {
			// we always add one byte for the validity
			constant_size += GetTypeIdSize(physical_type) + 1;
		}
	}
	if (all_constant) {
		if (constant_size <= sizeof(int64_t)) {
			bound_function.return_type = LogicalType::BIGINT;
		}
	}
	return std::move(result);
}